

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::WithFunctionSampleSyntax::getChild
          (TokenOrSyntax *__return_storage_ptr__,WithFunctionSampleSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  size_t index_local;
  WithFunctionSampleSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->with).kind;
    token._2_1_ = (this->with).field_0x2;
    token.numFlags.raw = (this->with).numFlags.raw;
    token.rawLen = (this->with).rawLen;
    token.info = (this->with).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->function).kind;
    token_00._2_1_ = (this->function).field_0x2;
    token_00.numFlags.raw = (this->function).numFlags.raw;
    token_00.rawLen = (this->function).rawLen;
    token_00.info = (this->function).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    token_01.kind = (this->sample).kind;
    token_01._2_1_ = (this->sample).field_0x2;
    token_01.numFlags.raw = (this->sample).numFlags.raw;
    token_01.rawLen = (this->sample).rawLen;
    token_01.info = (this->sample).info;
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 3:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,&this->portList->super_SyntaxNode);
    break;
  default:
    TokenOrSyntax::TokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

TokenOrSyntax WithFunctionSampleSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return with;
        case 1: return function;
        case 2: return sample;
        case 3: return portList;
        default: return nullptr;
    }
}